

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmconsol.cpp
# Opt level: O3

void __thiscall CVmFormatter::empty_buffers(CVmFormatter *this)

{
  this->linebuf_[0] = L'\0';
  this->field_0xef81 = this->field_0xef81 & 0xdf;
  this->pending_tab_align_ = VMFMT_TAB_NONE;
  this->linepos_ = 0;
  this->linecol_ = 0;
  this->is_continuation_ = 0;
  this->linecnt_ = 0;
  this->html_passthru_state_ = VMCON_HPS_NORMAL;
  return;
}

Assistant:

void CVmFormatter::empty_buffers(VMG0_)
{
    /* reset our buffer pointers */
    linepos_ = 0;
    linecol_ = 0;
    linebuf_[0] = '\0';
    just_did_nl_ = FALSE;
    is_continuation_ = FALSE;

    /* there's no pending tab now */
    pending_tab_align_ = VMFMT_TAB_NONE;

    /* start out at the first line */
    linecnt_ = 0;

    /* reset the HTML lexical state */
    html_passthru_state_ = VMCON_HPS_NORMAL;
}